

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86.cpp
# Opt level: O2

int __thiscall ncnn::Swish_x86::forward_inplace(Swish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  undefined1 (*pauVar5) [16];
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar10 = 0;
  uVar9 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar9 = uVar10;
  }
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pauVar5 = (undefined1 (*) [16])(sVar3 * uVar10 * sVar2 + (long)pvVar1);
    lVar8 = 0;
    for (iVar7 = 0; iVar7 + 3 < iVar6; iVar7 = iVar7 + 4) {
      auVar11 = *pauVar5;
      auVar20._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
      auVar20._8_4_ = auVar11._8_4_ ^ 0x80000000;
      auVar20._12_4_ = auVar11._12_4_ ^ 0x80000000;
      auVar21 = minps(auVar20,_DAT_0052bd70);
      auVar21 = maxps(auVar21,_DAT_0052bd80);
      fVar16 = auVar21._0_4_ * 1.442695 + 0.5;
      fVar17 = auVar21._4_4_ * 1.442695 + 0.5;
      fVar18 = auVar21._8_4_ * 1.442695 + 0.5;
      fVar19 = auVar21._12_4_ * 1.442695 + 0.5;
      fVar12 = (float)(int)fVar16;
      fVar13 = (float)(int)fVar17;
      fVar14 = (float)(int)fVar18;
      fVar15 = (float)(int)fVar19;
      fVar12 = fVar12 - (float)(-(uint)(fVar16 < fVar12) & 0x3f800000);
      fVar13 = fVar13 - (float)(-(uint)(fVar17 < fVar13) & 0x3f800000);
      fVar14 = fVar14 - (float)(-(uint)(fVar18 < fVar14) & 0x3f800000);
      fVar15 = fVar15 - (float)(-(uint)(fVar19 < fVar15) & 0x3f800000);
      fVar16 = fVar12 * -0.6931472 + auVar21._0_4_;
      fVar17 = fVar13 * -0.6931472 + auVar21._4_4_;
      fVar18 = fVar14 * -0.6931472 + auVar21._8_4_;
      fVar19 = fVar15 * -0.6931472 + auVar21._12_4_;
      auVar21._4_4_ =
           (float)((int)fVar13 * 0x800000 + 0x3f800000) *
           (fVar17 + 1.0 +
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17) + 1.0;
      auVar21._0_4_ =
           (float)((int)fVar12 * 0x800000 + 0x3f800000) *
           (fVar16 + 1.0 +
           (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
             0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16) + 1.0;
      auVar21._8_4_ =
           (float)((int)fVar14 * 0x800000 + 0x3f800000) *
           (fVar18 + 1.0 +
           (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
             0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * fVar18 * fVar18) + 1.0;
      auVar21._12_4_ =
           (float)((int)fVar15 * 0x800000 + 0x3f800000) *
           (fVar19 + 1.0 +
           (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
             0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * fVar19 * fVar19) + 1.0;
      auVar11 = divps(auVar11,auVar21);
      *pauVar5 = auVar11;
      pauVar5 = pauVar5 + 1;
      lVar8 = lVar8 + 4;
    }
    lVar4 = sVar3 * sVar2 * uVar10;
    for (; (int)lVar8 < iVar6; lVar8 = lVar8 + 1) {
      fVar12 = *(float *)((long)pvVar1 + lVar8 * 4 + lVar4);
      fVar13 = expf(-fVar12);
      *(float *)((long)pvVar1 + lVar8 * 4 + lVar4) = fVar12 / (fVar13 + 1.0);
    }
  }
  return 0;
}

Assistant:

int Swish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}